

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::ProcessInlineeEnd(BackwardPass *this,Instr *instr)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  ArgList *pAVar1;
  Type pIVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  InlineeFrameInfoValueType IVar6;
  StackSym *pSVar7;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar8;
  InlineeFrameInfo *pIVar9;
  SymOpnd *pSVar10;
  RegOpnd *pRVar11;
  long lVar12;
  int i;
  Instr *pIVar13;
  Instr *pIVar14;
  long lVar15;
  anon_class_8_1_8991fb9c_for_callback local_48;
  anon_class_8_1_8991fb9c_for_callback local_40;
  InlineeFrameInfo *local_38;
  
  if (this->currentPrePassLoop == (Loop *)0x0) {
    if (this->tag == DeadStorePhase) {
      this_01 = Func::GetJITFunctionBody(instr->m_func);
      bVar4 = JITTimeFunctionBody::UsesArgumentsObject(this_01);
      if ((bVar4) && (bVar4 = Func::IsStackArgsEnabled(instr->m_func), !bVar4)) {
        Func::DisableCanDoInlineArgOpt(instr->m_func);
      }
      if ((instr->m_func->field_0x240 & 2) != 0) {
        pIVar9 = instr->m_func->frameInfo;
        if (pIVar9 == (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x2079,"(instr->m_func->frameInfo)","instr->m_func->frameInfo");
          if (!bVar4) goto LAB_003d1792;
          *puVar8 = 0;
          pIVar9 = instr->m_func->frameInfo;
        }
        else {
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        }
        pAVar1 = pIVar9->arguments;
        lVar12 = 0;
        local_48.this = this;
        local_40.this = this;
        local_38 = pIVar9;
        for (lVar15 = 0; pIVar9 = local_38,
            lVar15 < (pAVar1->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).count; lVar15 = lVar15 + 1) {
          pIVar2 = (pAVar1->
                   super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                   ).buffer;
          iVar5 = *(int *)((long)&pIVar2->type + lVar12);
          if (iVar5 == 1) {
            InlineeFrameInfo::
            IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp:8314:51)>
            ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                      (&local_48,*(StackSym **)((long)&pIVar2->field_1 + lVar12));
            iVar5 = *(int *)((long)&pIVar2->type + lVar12);
          }
          if (iVar5 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                               ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                               "value.type != InlineeFrameInfoValueType_None");
            if (!bVar4) goto LAB_003d1792;
            *puVar8 = 0;
          }
          lVar12 = lVar12 + 0x18;
        }
        IVar6 = (local_38->function).type;
        if (IVar6 == InlineeFrameInfoValueType_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                             ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                             "function.type != InlineeFrameInfoValueType_None");
          if (!bVar4) goto LAB_003d1792;
          *puVar8 = 0;
          IVar6 = (pIVar9->function).type;
        }
        if (IVar6 == InlineeFrameInfoValueType_Sym) {
          InlineeFrameInfo::
          IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp:8314:51)>
          ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                    (&local_40,(pIVar9->function).field_1.sym);
        }
      }
    }
    else if (this->tag == BackwardPhase) {
      pSVar7 = IR::Opnd::GetStackSym(instr->m_src2);
      pIVar13 = (pSVar7->field_5).m_instrDef;
      if ((pIVar13 != (Instr *)0x0 & pSVar7->field_0x18) == 1) {
        local_38 = (InlineeFrameInfo *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        pIVar9 = (InlineeFrameInfo *)__tls_get_addr(&PTR_013e5f18);
        (pIVar9->function).type = InlineeFrameInfoValueType_Sym;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar4) {
LAB_003d1792:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        (pIVar9->function).type = InlineeFrameInfoValueType_None;
        pIVar13 = (pSVar7->field_5).m_instrDef;
        local_38 = pIVar9;
      }
      do {
        if ((pIVar13->m_src2 == (Opnd *)0x0) ||
           (bVar4 = IR::Opnd::IsSymOpnd(pIVar13->m_src2), !bVar4)) {
LAB_003d15a7:
          pIVar14 = (Instr *)0x0;
        }
        else {
          pSVar10 = IR::Opnd::AsSymOpnd(pIVar13->m_src2);
          pSVar7 = Sym::AsStackSym(pSVar10->m_sym);
          bVar4 = StackSym::IsArgSlotSym(pSVar7);
          pIVar9 = local_38;
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            (pIVar9->function).type = InlineeFrameInfoValueType_Sym;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar4) goto LAB_003d1792;
            (pIVar9->function).type = InlineeFrameInfoValueType_None;
          }
          if (((((pSVar7->field_0x18 & 1) == 0) || ((pSVar7->field_5).m_instrDef == (Instr *)0x0))
              && (bVar4 = Func::IsInPhase(instr->m_func,FGPeepsPhase), !bVar4)) &&
             (bVar4 = Func::IsInPhase(instr->m_func,FGBuildPhase), !bVar4)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            (pIVar9->function).type = InlineeFrameInfoValueType_Sym;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar4) goto LAB_003d1792;
            (pIVar9->function).type = InlineeFrameInfoValueType_None;
          }
          if ((pSVar7->field_0x18 & 1) == 0) goto LAB_003d15a7;
          pIVar14 = (pSVar7->field_5).m_instrDef;
        }
        if (pIVar13->m_opcode != ArgOut_A_InlineSpecialized) {
          if (pIVar13->m_opcode == StartCall) {
            if (pIVar14 == (Instr *)0x0) {
              return;
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pIVar9 = local_38;
            (local_38->function).type = InlineeFrameInfoValueType_Sym;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
            if (bVar4) {
              (pIVar9->function).type = InlineeFrameInfoValueType_None;
              return;
            }
            goto LAB_003d1792;
          }
          bVar4 = IR::Opnd::IsRegOpnd(pIVar13->m_src1);
          if (bVar4) {
            this_00 = this->currentBlock->upwardExposedUses;
            pRVar11 = IR::Opnd::AsRegOpnd(pIVar13->m_src1);
            BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pRVar11->m_sym->super_Sym).m_id);
          }
        }
        pIVar13 = pIVar14;
      } while (pIVar14 != (Instr *)0x0);
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessInlineeEnd(IR::Instr* instr)
{
    if (this->IsPrePass())
    {
        return;
    }
    if (this->tag == Js::BackwardPhase)
    {
        // Commenting out to allow for argument length and argument[constant] optimization
        // Will revisit in phase two
        /*if (!GlobOpt::DoInlineArgsOpt(instr->m_func))
        {
            return;
        }*/

        // This adds a use for function sym as part of InlineeStart & all the syms referenced by the args.
        // It ensure they do not get cleared from the copy prop sym map.
        instr->IterateArgInstrs([=](IR::Instr* argInstr){
            if (argInstr->GetSrc1()->IsRegOpnd())
            {
                this->currentBlock->upwardExposedUses->Set(argInstr->GetSrc1()->AsRegOpnd()->m_sym->m_id);
            }
            return false;
        });
    }
    else if (this->tag == Js::DeadStorePhase)
    {
        if (instr->m_func->GetJITFunctionBody()->UsesArgumentsObject() && !instr->m_func->IsStackArgsEnabled())
        {
            instr->m_func->DisableCanDoInlineArgOpt();
        }

        if (instr->m_func->m_hasInlineArgsOpt)
        {
            Assert(instr->m_func->frameInfo);
            instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
            {
                this->currentBlock->upwardExposedUses->Set(argSym->m_id);
            });
        }
    }
}